

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.h
# Opt level: O1

int __thiscall
UnitTest::TestRunner::RunTestsIf<UnitTest::True>
          (TestRunner *this,TestList *list,char *suiteName,True *predicate,int maxTestTimeInMs)

{
  int iVar1;
  Test *curTest;
  
  curTest = TestList::GetHead(list);
  do {
    if (curTest == (Test *)0x0) {
      iVar1 = Finish(this);
      return iVar1;
    }
    if (suiteName == (char *)0x0) {
LAB_002ac679:
      RunTest((TestRunner *)list,this->m_result,curTest,maxTestTimeInMs);
    }
    else {
      list = (TestList *)(curTest->m_details).suiteName;
      iVar1 = strcmp((char *)list,suiteName);
      if (iVar1 == 0) goto LAB_002ac679;
    }
    curTest = curTest->next;
  } while( true );
}

Assistant:

int RunTestsIf(TestList const& list, char const* suiteName, 
				   const Predicate& predicate, int maxTestTimeInMs) const
	{
	    Test* curTest = list.GetHead();

	    while (curTest != 0)
	    {
		    if (IsTestInSuite(curTest, suiteName) && predicate(curTest))
				RunTest(m_result, curTest, maxTestTimeInMs);

			curTest = curTest->next;
	    }

	    return Finish();
	}